

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void colmajor_to_rowmajor<double>
               (double *X,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *X_row_major)

{
  long lVar1;
  size_t sVar2;
  double *pdVar3;
  size_t sVar4;
  
  std::vector<double,_std::allocator<double>_>::resize(X_row_major,ncols * nrows);
  lVar1 = 0;
  for (sVar2 = 0; sVar2 != nrows; sVar2 = sVar2 + 1) {
    pdVar3 = (double *)
             ((long)(X_row_major->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar1);
    for (sVar4 = 0; ncols != sVar4; sVar4 = sVar4 + 1) {
      *pdVar3 = X[sVar4];
      pdVar3 = pdVar3 + nrows;
    }
    X = X + ncols;
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict X, size_t nrows, size_t ncols, std::vector<double> &X_row_major)
{
    X_row_major.resize(nrows * ncols);
    for (size_t row = 0; row < nrows; row++)
        for (size_t col = 0; col < ncols; col++)
            X_row_major[row + col*nrows] = X[col + row*ncols];
}